

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * cuddAddVectorComposeRecur
                   (DdManager *dd,DdHashTable *table,DdNode *f,DdNode **vector,int deepest)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *h;
  DdNode *value;
  
  iVar2 = 0x7fffffff;
  if ((ulong)f->index != 0x7fffffff) {
    iVar2 = dd->perm[f->index];
  }
  pDVar3 = f;
  if ((iVar2 <= deepest) && (pDVar3 = cuddHashTableLookup1(table,f), pDVar3 == (DdNode *)0x0)) {
    pDVar3 = cuddAddVectorComposeRecur(dd,table,(f->type).kids.T,vector,deepest);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      h = cuddAddVectorComposeRecur(dd,table,(f->type).kids.E,vector,deepest);
      value = pDVar3;
      if (h != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        value = cuddAddIteRecur(dd,vector[f->index],pDVar3,h);
        if (value == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          value = h;
        }
        else {
          piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_RecursiveDeref(dd,h);
          if (((ulong)f->ref == 1) ||
             (iVar2 = cuddHashTableInsert1(table,f,value,(ulong)f->ref - 1), iVar2 != 0)) {
            piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return value;
          }
        }
      }
      Cudd_RecursiveDeref(dd,value);
    }
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

static DdNode *
cuddAddVectorComposeRecur(
  DdManager * dd /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * f /* ADD in which to compose */,
  DdNode ** vector /* functions to substitute */,
  int  deepest /* depth of deepest substitution */)
{
    DdNode      *T,*E;
    DdNode      *res;

    statLine(dd);
    /* If we are past the deepest substitution, return f. */
    if (cuddI(dd,f->index) > deepest) {
        return(f);
    }

    if ((res = cuddHashTableLookup1(table,f)) != NULL) {
#ifdef DD_DEBUG
        addVectorComposeHits++;
#endif
        return(res);
    }

    /* Split and recur on children of this node. */
    T = cuddAddVectorComposeRecur(dd,table,cuddT(f),vector,deepest);
    if (T == NULL)  return(NULL);
    cuddRef(T);
    E = cuddAddVectorComposeRecur(dd,table,cuddE(f),vector,deepest);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* Retrieve the 0-1 ADD for the current top variable and call
    ** cuddAddIteRecur with the T and E we just created.
    */
    res = cuddAddIteRecur(dd,vector[f->index],T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, T);
    Cudd_RecursiveDeref(dd, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again
    */
    if (f->ref != 1) {
        ptrint fanout = (ptrint) f->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,f,res,fanout)) {
            Cudd_RecursiveDeref(dd, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(res);

}